

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  reference pvVar2;
  ostream *poVar3;
  int iVar4;
  size_t i;
  ulong uVar5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  arguments;
  ExamResults examResults;
  SolutionCollection solutions;
  
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::vector<char**,void>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&arguments,argv,
             argv + argc,(allocator_type *)&examResults);
  if ((ulong)((long)arguments.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
             (long)arguments.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start) < 0x21) {
    InferExamAnswers::Parser::getExamResults(&examResults,(istream *)&std::cin);
    InferExamAnswers::Algorithm::runAlgorithm(&solutions,&examResults);
    if (solutions.size == 1) {
      for (uVar5 = 0; uVar5 < examResults.questionCount; uVar5 = uVar5 + 1) {
        std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      }
    }
    else {
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::operator<<(poVar3," solutions");
    }
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    InferExamAnswers::ExamResults::~ExamResults(&examResults);
    iVar4 = 0;
  }
  else {
    pvVar2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::at(&arguments,1);
    bVar1 = std::operator==(pvVar2,"--version");
    if (!bVar1) {
      pvVar2 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::at(&arguments,1);
      bVar1 = std::operator==(pvVar2,"-v");
      if (!bVar1) {
        pvVar2 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::at(&arguments,1);
        bVar1 = std::operator==(pvVar2,"--help");
        if (!bVar1) {
          pvVar2 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::at(&arguments,1);
          bVar1 = std::operator==(pvVar2,"-h");
          if (!bVar1) {
            poVar3 = std::operator<<((ostream *)&std::cout,"unknown options: \"");
            pvVar2 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::at(&arguments,1);
            poVar3 = std::operator<<(poVar3,(string *)pvVar2);
            poVar3 = std::operator<<(poVar3,"\"");
            poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
            std::endl<char,std::char_traits<char>>(poVar3);
            pvVar2 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::at(&arguments,0);
            printHelp(pvVar2);
            iVar4 = 1;
            goto LAB_00105afb;
          }
        }
        iVar4 = 0;
        pvVar2 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::at(&arguments,0);
        printHelp(pvVar2);
        goto LAB_00105afb;
      }
    }
    iVar4 = 0;
    printVersion();
  }
LAB_00105afb:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&arguments);
  return iVar4;
}

Assistant:

int main(int argc, char** argv)
{
	// Because ptr arithmatic is not allowed but we need it here
	// to access program arguments we explicitly NOLINT here.
	std::vector<std::string> arguments(argv, argv + argc); // NOLINT

	if (arguments.size() >= 2) {
		if (arguments.at(1) == "--version" || arguments.at(1) == "-v") {
			printVersion();
		} else if (arguments.at(1) == "--help" || arguments.at(1) == "-h") {
			printHelp(arguments.at(0));
		} else {
			std::cout << "unknown options: \"" << arguments.at(1) << "\"" << std::endl << std::endl;
			printHelp(arguments.at(0));
			return EXIT_FAILURE;
		}
		return EXIT_SUCCESS;
	}

	const auto examResults = InferExamAnswers::Parser::getExamResults(std::cin);

	const auto solutions = InferExamAnswers::Algorithm::runAlgorithm(examResults);

	if (solutions.getSize() == 1) {
		const auto s = solutions.getSolution();
		for (size_t i = 0; i < examResults.questionCount; ++i) {
			std::cout << ((s >> (examResults.questionCount - i - 1)) & 1U);
		}
	} else {
		std::cout << solutions.getSize() << " solutions";
	}

	std::cout << std::endl;

	return EXIT_SUCCESS;
}